

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

int get_minq_index(double maxq,double x3,double x2,double x1,aom_bit_depth_t bit_depth)

{
  int iVar1;
  double desired_q;
  
  desired_q = ((x3 * maxq + x2) * maxq + x1) * maxq;
  if (maxq <= desired_q) {
    desired_q = maxq;
  }
  if (2.0 < desired_q) {
    iVar1 = av1_find_qindex(desired_q,bit_depth,0,0xff);
    return iVar1;
  }
  return 0;
}

Assistant:

static int get_minq_index(double maxq, double x3, double x2, double x1,
                          aom_bit_depth_t bit_depth) {
  const double minqtarget = AOMMIN(((x3 * maxq + x2) * maxq + x1) * maxq, maxq);

  // Special case handling to deal with the step from q2.0
  // down to lossless mode represented by q 1.0.
  if (minqtarget <= 2.0) return 0;

  return av1_find_qindex(minqtarget, bit_depth, 0, QINDEX_RANGE - 1);
}